

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::DescriptorProto::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  DescriptorProto *this;
  string *value;
  DescriptorProto **v1;
  DescriptorProto **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *pRVar3;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *pRVar4;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::DescriptorProto> *other;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *this_01;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *other_00;
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *this_02;
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *other_01;
  RepeatedPtrField<google::protobuf::OneofDescriptorProto> *this_03;
  RepeatedPtrField<google::protobuf::OneofDescriptorProto> *other_02;
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *this_04;
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *other_03;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_05;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *other_04;
  uint32_t *puVar5;
  Arena *arena_00;
  MessageOptions *pMVar6;
  LogMessage local_a8;
  Voidify local_91;
  uint local_90;
  uint32_t cached_has_bits;
  LogMessage local_80;
  Voidify local_69;
  DescriptorProto *local_68;
  Nullable<const_char_*> local_60;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  DescriptorProto *from;
  DescriptorProto *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_28;
  string *local_20;
  DescriptorProto *local_18;
  anon_union_224_1_493b367e_for_DescriptorProto_3 *local_10;
  
  arena = (Arena *)from_msg;
  from = (DescriptorProto *)to_msg;
  _this = (DescriptorProto *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)MessageLite::GetArena(to_msg);
  local_68 = (DescriptorProto *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::DescriptorProto_const*>(&local_68);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::DescriptorProto*>
                 (&from);
  local_60 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::DescriptorProto_const*,google::protobuf::DescriptorProto*>
                       (v1,v2,"&from != _this");
  if (local_60 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_60);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x1139,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_80);
  }
  local_90 = 0;
  pRVar3 = _internal_mutable_field(from);
  pRVar4 = _internal_field((DescriptorProto *)arena);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::MergeFrom(pRVar3,pRVar4);
  this_00 = _internal_mutable_nested_type(from);
  other = _internal_nested_type((DescriptorProto *)arena);
  RepeatedPtrField<google::protobuf::DescriptorProto>::MergeFrom(this_00,other);
  this_01 = _internal_mutable_enum_type(from);
  other_00 = _internal_enum_type((DescriptorProto *)arena);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::MergeFrom(this_01,other_00);
  this_02 = _internal_mutable_extension_range(from);
  other_01 = _internal_extension_range((DescriptorProto *)arena);
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::MergeFrom(this_02,other_01);
  pRVar3 = _internal_mutable_extension(from);
  pRVar4 = _internal_extension((DescriptorProto *)arena);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::MergeFrom(pRVar3,pRVar4);
  this_03 = _internal_mutable_oneof_decl(from);
  other_02 = _internal_oneof_decl((DescriptorProto *)arena);
  RepeatedPtrField<google::protobuf::OneofDescriptorProto>::MergeFrom(this_03,other_02);
  this_04 = _internal_mutable_reserved_range(from);
  other_03 = _internal_reserved_range((DescriptorProto *)arena);
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::MergeFrom(this_04,other_03);
  this_05 = _internal_mutable_reserved_name_abi_cxx11_(from);
  other_04 = _internal_reserved_name_abi_cxx11_((DescriptorProto *)arena);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(this_05,other_04);
  puVar5 = internal::HasBits<1>::operator[]((HasBits<1> *)&(arena->impl_).field_0x10,0);
  this = from;
  local_90 = *puVar5;
  if ((local_90 & 7) != 0) {
    if ((local_90 & 1) != 0) {
      local_20 = _internal_name_abi_cxx11_((DescriptorProto *)arena);
      local_18 = this;
      local_10 = &this->field_0;
      puVar5 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
      value = local_20;
      *puVar5 = *puVar5 | 1;
      arena_00 = MessageLite::GetArena((MessageLite *)this);
      internal::ArenaStringPtr::Set<>(&(this->field_0)._impl_.name_,value,arena_00);
    }
    if ((local_90 & 2) != 0) {
      if (arena[1].impl_.first_arena_.limit_ == (char *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x1152,"from._impl_.options_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_91,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_a8);
      }
      if ((from->field_0)._impl_.options_ == (MessageOptions *)0x0) {
        to_msg_local = (MessageLite *)arena[1].impl_.first_arena_.limit_;
        local_28 = absl_log_internal_check_op_result;
        pMVar6 = (MessageOptions *)
                 Arena::CopyConstruct<google::protobuf::MessageOptions>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.options_ = pMVar6;
      }
      else {
        MessageOptions::MergeFrom
                  ((from->field_0)._impl_.options_,
                   (MessageOptions *)arena[1].impl_.first_arena_.limit_);
      }
    }
    if ((local_90 & 4) != 0) {
      (from->field_0)._impl_.visibility_ = *(int *)&arena[1].impl_.first_arena_.prefetch_ptr_;
    }
  }
  uVar1 = local_90;
  puVar5 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar5 = uVar1 | *puVar5;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void DescriptorProto::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<DescriptorProto*>(&to_msg);
  auto& from = static_cast<const DescriptorProto&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.DescriptorProto)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_field()->MergeFrom(
      from._internal_field());
  _this->_internal_mutable_nested_type()->MergeFrom(
      from._internal_nested_type());
  _this->_internal_mutable_enum_type()->MergeFrom(
      from._internal_enum_type());
  _this->_internal_mutable_extension_range()->MergeFrom(
      from._internal_extension_range());
  _this->_internal_mutable_extension()->MergeFrom(
      from._internal_extension());
  _this->_internal_mutable_oneof_decl()->MergeFrom(
      from._internal_oneof_decl());
  _this->_internal_mutable_reserved_range()->MergeFrom(
      from._internal_reserved_range());
  _this->_internal_mutable_reserved_name()->MergeFrom(from._internal_reserved_name());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_name(from._internal_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.options_ != nullptr);
      if (_this->_impl_.options_ == nullptr) {
        _this->_impl_.options_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.options_);
      } else {
        _this->_impl_.options_->MergeFrom(*from._impl_.options_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.visibility_ = from._impl_.visibility_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}